

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpAcceptSubscriptionExt
              (UpnpDevice_Handle Hnd,char *DevID_const,char *ServName_const,IXML_Document *PropSet,
              char *SubsId)

{
  Upnp_Handle_Type UVar1;
  char *ServName;
  char *DevID;
  Handle_Info *SInfo;
  int line;
  int ret;
  char *SubsId_local;
  IXML_Document *PropSet_local;
  char *ServName_const_local;
  char *DevID_const_local;
  UpnpDevice_Handle Hnd_local;
  
  SInfo._4_4_ = 0;
  SInfo._0_4_ = 0;
  DevID = (char *)0x0;
  _line = SubsId;
  SubsId_local = (char *)PropSet;
  PropSet_local = (IXML_Document *)ServName_const;
  ServName_const_local = DevID_const;
  DevID_const_local._4_4_ = Hnd;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xaec,"Inside UpnpAcceptSubscription\n");
  if (UpnpSdkInit == 1) {
    HandleReadLock(".upnp/src/api/upnpapi.c",0xaf5);
    UVar1 = GetHandleInfo(DevID_const_local._4_4_,(Handle_Info **)&DevID);
    if (UVar1 == HND_DEVICE) {
      if (DevID_const == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xb01);
        SInfo._0_4_ = 0xb02;
        SInfo._4_4_ = 0xffffff9b;
      }
      else if (ServName_const == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xb07);
        SInfo._0_4_ = 0xb08;
        SInfo._4_4_ = 0xffffff9b;
      }
      else if (_line == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xb0d);
        SInfo._0_4_ = 0xb0e;
        SInfo._4_4_ = 0xffffff9b;
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xb1d);
        SInfo._0_4_ = 0xb1f;
        SInfo._4_4_ = genaInitNotifyExt(DevID_const_local._4_4_,DevID_const,ServName_const,
                                        (IXML_Document *)SubsId_local,_line);
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xafb);
      SInfo._0_4_ = 0xafc;
      SInfo._4_4_ = 0xffffff9c;
    }
  }
  else {
    SInfo._0_4_ = 0xaf0;
    SInfo._4_4_ = 0xffffff8c;
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",(int)SInfo,
             "Exiting UpnpAcceptSubscription, ret = %d.\n",(ulong)SInfo._4_4_);
  return SInfo._4_4_;
}

Assistant:

int UpnpAcceptSubscriptionExt(UpnpDevice_Handle Hnd,
	const char *DevID_const,
	const char *ServName_const,
	IXML_Document *PropSet,
	const Upnp_SID SubsId)
{
	int ret = 0;
	int line = 0;
	struct Handle_Info *SInfo = NULL;
	char *DevID = (char *)DevID_const;
	char *ServName = (char *)ServName_const;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpAcceptSubscription\n");

	if (UpnpSdkInit != 1) {
		line = __LINE__;
		ret = UPNP_E_FINISH;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);

	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	if (DevID == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (ServName == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (SubsId == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
		/* Now accepts an empty state list, so the code below is
		 * commented out */
		#if 0
	if (PropSet == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
		#endif

	HandleUnlock(__FILE__, __LINE__);

	line = __LINE__;
	ret = genaInitNotifyExt(Hnd, DevID, ServName, PropSet, SubsId);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		line,
		"Exiting UpnpAcceptSubscription, ret = %d.\n",
		ret);

	return ret;
}